

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

void __thiscall MemoryFootprintAllocator::fastFree(MemoryFootprintAllocator *this,void *ptr)

{
  mapped_type *pmVar1;
  void *in_RSI;
  long in_RDI;
  iterator __position;
  size_t size;
  MutexLockGuard g;
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *in_stack_ffffffffffffff88;
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *in_stack_ffffffffffffff90;
  key_type *in_stack_ffffffffffffffc8;
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *in_stack_ffffffffffffffd0;
  undefined4 local_28;
  
  ncnn::MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)in_stack_ffffffffffffff90,(Mutex *)in_stack_ffffffffffffff88);
  pmVar1 = std::
           map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_28 = (int)*pmVar1;
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) - local_28;
  __position._M_node = (_Base_ptr)(in_RDI + 0x38);
  std::
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::find(in_stack_ffffffffffffff88,(key_type *)0x1951b1);
  std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
  ::erase_abi_cxx11_(in_stack_ffffffffffffff90,__position);
  if (in_RSI != (void *)0x0) {
    free(in_RSI);
  }
  ncnn::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x195208);
  return;
}

Assistant:

virtual void fastFree(void* ptr)
    {
        ncnn::MutexLockGuard g(lock);
        size_t size = bookkeeper[ptr];
        current_memory_usage -= size;
        bookkeeper.erase(bookkeeper.find(ptr));
        ncnn::fastFree(ptr);
    }